

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O1

void anon_unknown.dwarf_f869e::check_equal
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *v,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expected)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> u;
  json j;
  undefined1 local_58 [8];
  pointer puStack_50;
  pointer local_48;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_38;
  bson_encode_options local_28;
  
  test_equal(v,expected);
  local_48 = (pointer)CONCAT44(local_48._4_4_,0x400);
  local_58 = (undefined1  [8])(::jsoncons::bson::bson_decode_options::vtable + 0x18);
  puStack_50 = ::jsoncons::bson::bson_decode_options::vtable + 0x40;
  ::jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((bson *)&local_38,v,(bson_decode_options *)local_58);
  local_58 = (undefined1  [8])0x0;
  puStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_28._16_4_ = 0x400;
  local_28._vptr_bson_encode_options =
       (_func_int **)(::jsoncons::bson::bson_encode_options::vtable + 0x18);
  local_28._8_8_ = 0xb59388;
  ::jsoncons::bson::
  encode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_38,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,&local_28);
  test_equal(v,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete((void *)local_58,(long)local_48 - (long)local_58);
  }
  ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_38);
  return;
}

Assistant:

void check_equal(const std::vector<uint8_t>& v, const std::vector<uint8_t>& expected)
    {
        test_equal(v, expected);
        JSONCONS_TRY
        {
            json j = bson::decode_bson<json>(v);
            std::vector<uint8_t> u;
            bson::encode_bson(j, u);
            test_equal(v,u);
        }